

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O2

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::postProcess(Field<OpenMD::Vector3<double>_> *this)

{
  long lVar1;
  pointer pvVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  pvVar2 = (this->field_).
           super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)(((long)(this->field_).
                             super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
      uVar5 = uVar5 + 1) {
    lVar7 = *(long *)&pvVar2[uVar6].
                      super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    for (uVar8 = 0;
        (ulong)uVar8 <
        (ulong)(((long)*(pointer *)
                        ((long)&pvVar2[uVar6].
                                super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar7) / 0x18);
        uVar8 = uVar8 + 1) {
      uVar3 = 0;
      lVar9 = (ulong)uVar8 * 0x18;
      while( true ) {
        uVar4 = (ulong)uVar3;
        lVar7 = *(long *)&pvVar2[uVar6].
                          super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar1 = *(long *)(lVar7 + 8 + lVar9) - *(long *)(lVar7 + lVar9);
        if ((ulong)(lVar1 / 0x18) <= uVar4) break;
        if (0.0 < *(double *)
                   (*(long *)(*(long *)&(this->dens_).
                                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar9) + uVar4 * 8)) {
          Vector<double,_3U>::div
                    ((Vector<double,_3U> *)(*(long *)(lVar7 + lVar9) + uVar4 * 0x18),(int)lVar7,
                     (int)(lVar1 % 0x18));
          pvVar2 = (this->field_).
                   super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar3 = uVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void Field<T>::postProcess() {
    for (unsigned int i = 0; i < field_.size(); ++i) {
      for (unsigned int j = 0; j < field_[i].size(); ++j) {
        for (unsigned int k = 0; k < field_[i][j].size(); ++k) {
          if (dens_[i][j][k] > 0.0) { field_[i][j][k] /= dens_[i][j][k]; }
        }
      }
    }
  }